

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O1

Vec_Int_t * findHintOutputs(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (int *)0x0;
  pVVar1 = pNtk->vPos;
  pVVar4 = (Vec_Int_t *)0x0;
  pVVar5 = pVVar4;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar1->pArray[lVar3]);
      pcVar2 = strstr(pcVar2,"hint_");
      if (pcVar2 != (char *)0x0) {
        Vec_IntPush(p,(int)lVar3);
        pVVar4 = (Vec_Int_t *)(ulong)((int)pVVar4 + 1);
      }
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vPos;
    } while (lVar3 < pVVar1->nSize);
    pVVar5 = p;
    if ((int)pVVar4 == 0) {
      pVVar5 = (Vec_Int_t *)0x0;
    }
  }
  return pVVar5;
}

Assistant:

Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk)
{
    int i, numElementPush = 0;
    Abc_Obj_t *pNode;
    Vec_Int_t *vHintPoIntdex;

    vHintPoIntdex = Vec_IntAlloc(0);
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        if( strstr( Abc_ObjName( pNode ), "hint_" ) != NULL )
        {
            Vec_IntPush( vHintPoIntdex, i );
            numElementPush++;
        }
    }    
    
    if( numElementPush == 0 )
        return NULL;
    else
        return vHintPoIntdex;
}